

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::setIPV4Address(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                        bool exception)

{
  element_type *peVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  long *plVar4;
  invalid_argument *piVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  bool bVar7;
  allocator local_1e5;
  undefined4 local_1e4;
  string elem;
  stringstream in;
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)&in,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&in);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&in);
  local_1e4 = (undefined4)CONCAT71(in_register_00000009,exception);
  if (plVar4 == (long *)0x0) {
    if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&elem,"Feature not found: ",&local_1e5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&elem,
                     name);
      std::invalid_argument::invalid_argument(piVar5,(string *)&in);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                      ((long)plVar4 + *(long *)(*plVar4 + -0x28));
    if ((iVar2 == 4) || (iVar2 == 2)) {
      plVar4 = (long *)__dynamic_cast(plVar4,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      if (plVar4 != (long *)0x0) {
        std::__cxx11::string::string((string *)&elem,value,&local_1e5);
        std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)&elem,_S_out|_S_in);
        std::__cxx11::string::~string((string *)&elem);
        elem._M_dataplus._M_p = (pointer)&elem.field_2;
        elem._M_string_length = 0;
        elem.field_2._M_local_buf[0] = '\0';
        iVar2 = 4;
        uVar6 = 0;
        while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&in,(string *)&elem,'.');
          uVar3 = std::__cxx11::stoi(&elem,(size_t *)0x0,10);
          uVar6 = uVar6 << 8 | (ulong)(uVar3 & 0xff);
        }
        (**(code **)(*plVar4 + 0x38))(plVar4,uVar6,1);
        std::__cxx11::string::~string((string *)&elem);
        std::__cxx11::stringstream::~stringstream((stringstream *)&in);
        return true;
      }
      if (exception) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&elem,"Feature not integer: ",&local_1e5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                       &elem,name);
        std::invalid_argument::invalid_argument(piVar5,(string *)&in);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    else if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&elem,"Feature not writable: ",&local_1e5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&elem,
                     name);
      std::invalid_argument::invalid_argument(piVar5,(string *)&in);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return false;
}

Assistant:

bool setIPV4Address(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IInteger *val=dynamic_cast<GenApi::IInteger *>(node);

        if (val != 0)
        {
          int64_t ip=0;

          std::stringstream in(value);
          std::string elem;

          for (int i=0; i<4; i++)
          {
            getline(in, elem, '.');
            ip=(ip<<8)|(stoi(elem)&0xff);
          }

          val->SetValue(ip);
          ret=true;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not integer: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}